

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

QString * __thiscall QString::setUnicode(QString *this,QChar *unicode,qsizetype size)

{
  resize(this,size);
  if (size != 0 && unicode != (QChar *)0x0) {
    memcpy((this->d).ptr,unicode,size * 2);
  }
  return this;
}

Assistant:

QString& QString::setUnicode(const QChar *unicode, qsizetype size)
{
     resize(size);
     if (unicode && size)
         memcpy(d.data(), unicode, size * sizeof(QChar));
     return *this;
}